

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall
ObjectTest_basic_get_list_Test::~ObjectTest_basic_get_list_Test
          (ObjectTest_basic_get_list_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_list) {
	object obj;

	EXPECT_TRUE(obj.get<std::list<bool>>().empty());
	EXPECT_TRUE(obj.get<std::list<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::list<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::list<short>>().empty());
	EXPECT_TRUE(obj.get<std::list<int>>().empty());
	EXPECT_TRUE(obj.get<std::list<long>>().empty());
	EXPECT_TRUE(obj.get<std::list<long long>>().empty());
	EXPECT_TRUE(obj.get<std::list<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::list<float>>().empty());
	EXPECT_TRUE(obj.get<std::list<double>>().empty());
	EXPECT_TRUE(obj.get<std::list<long double>>().empty());
	EXPECT_TRUE(obj.get<std::list<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::list<object>>().empty());
}